

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferComputeInstance::iterate
          (TestStatus *__return_storage_ptr__,TexelBufferComputeInstance *this)

{
  float *pfVar1;
  float fVar2;
  ShaderInputInterface SVar3;
  DescriptorUpdateMethod DVar4;
  Allocation *pAVar5;
  undefined8 *puVar6;
  void *pvVar7;
  bool bVar8;
  TestStatus *pTVar9;
  bool bVar10;
  int i;
  VkFormat value;
  size_t sVar11;
  ostream *this_00;
  DescriptorPoolBuilder *pDVar12;
  pointer rawUpdateData;
  ulong uVar13;
  VkDescriptorUpdateTemplateKHR updateTemplate;
  ulong uVar14;
  int resultNdx;
  char *pcVar15;
  long lVar16;
  TexelBufferComputeInstance *pTVar17;
  bool bVar18;
  deUint32 dVar19;
  int iVar20;
  VkDescriptorSetLayout *descriptorSetLayouts;
  TexelBufferComputeInstance *pTVar21;
  ulong uVar22;
  int *piVar23;
  float fVar24;
  Vector<bool,_4> res_1;
  Vec4 result;
  Vec4 results [4];
  ComputePipeline pipeline;
  Vec4 reference;
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  VkDescriptorSetAllocateInfo allocInfo;
  ostringstream msg;
  VkDescriptorSet descriptorSets [1];
  Vec4 conversionThreshold;
  TexelBufferComputeInstance *local_478;
  char local_46c [4];
  undefined1 local_468 [16];
  VkDescriptorSet local_458;
  pointer pVStack_450;
  void *local_448;
  deUint64 dStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ComputePipeline local_418;
  TestStatus *local_3d0;
  undefined1 local_3c8 [24];
  pointer pVStack_3b0;
  void *local_3a8;
  deUint64 dStack_3a0;
  ImmutableSamplerInfo local_398;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_390;
  float local_378 [4];
  VkDescriptorPool local_368;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_360;
  undefined1 local_348 [8];
  pointer pVStack_340;
  VkDescriptorPool local_338;
  deUint32 dStack_330;
  VkShaderStageFlags VStack_32c;
  pointer local_328;
  pointer local_320;
  pointer local_318;
  pointer local_308;
  ios_base local_2d0 [264];
  ComputeCommand local_1c8;
  ios_base local_158 [272];
  VkDescriptorSet local_48;
  float afStack_40 [4];
  
  local_478 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c8,"Fetching 4 values from image in compute shader.\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c8,"Single descriptor set. Descriptor set contains ",0x2f);
  SVar3 = local_478->m_shaderInterface;
  if (SVar3 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pcVar15 = "single";
  }
  else if (SVar3 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    pcVar15 = "two";
  }
  else {
    pcVar15 = (char *)0x0;
    if (SVar3 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
      pcVar15 = "an array (size 2) of";
    }
  }
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)&local_478 +
                    (int)((DeviceInterface *)((long)local_1c8.m_vki - 0x18))->_vptr_DeviceInterface
                    + 0x2b0);
  }
  else {
    sVar11 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,pcVar15,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c8," descriptor(s) of type ",0x17);
  pcVar15 = ::vk::getDescriptorTypeName(local_478->m_descriptorType);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)&local_478 +
                    (int)((DeviceInterface *)((long)local_1c8.m_vki - 0x18))->_vptr_DeviceInterface
                    + 0x2b0);
  }
  else {
    sVar11 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,pcVar15,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c8,"Buffer view is created with a ",0x1e);
  pcVar15 = "View offset is zero, dynamic offset is zero";
  if (local_478->m_nonzeroViewOffset != false) {
    pcVar15 = "View offset is zero, dynamic offset is non-zero";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1c8,pcVar15 + 0x27,(ulong)local_478->m_nonzeroViewOffset * 4 + 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8," offset.\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"Buffer format is ",0x11)
  ;
  value = ::vk::mapTextureFormat(&(local_478->m_texelBuffers).m_imageFormat);
  pcVar15 = ::vk::getFormatName(value);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)&local_478 +
                    (int)((DeviceInterface *)((long)local_1c8.m_vki - 0x18))->_vptr_DeviceInterface
                    + 0x2b0);
  }
  else {
    sVar11 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,pcVar15,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,".\n",2);
  piVar23 = &BindingModel::(anonymous_namespace)::TexelBufferInstanceBuffers::getFetchPos(int)::
             fetchPositions;
  lVar16 = 0;
  local_3d0 = __return_storage_ptr__;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"Test sample ",0xc);
    this_00 = (ostream *)std::ostream::operator<<(&local_1c8,(uint)lVar16);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,": fetch at position ",0x14);
    std::ostream::operator<<(this_00,*piVar23);
    if (local_478->m_shaderInterface != SHADER_INPUT_SINGLE_DESCRIPTOR) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c8," from texelBuffer ",0x12);
      std::ostream::operator<<(&local_1c8,(uint)lVar16 & 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"\n",1);
    lVar16 = lVar16 + 1;
    piVar23 = piVar23 + 1;
  } while (lVar16 != 4);
  local_348 = (undefined1  [8])((local_478->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_340);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pVStack_340,
             (char *)local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                     m_data.object.m_internal,
             (long)local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                   deleter.m_deviceIface);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((VkDevice *)
      local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
      m_internal !=
      &local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
       m_device) {
    operator_delete((void *)local_418.m_pipelineLayout.
                            super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
                    (ulong)(local_418.m_pipelineLayout.
                            super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device +
                           1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_340);
  std::ios_base::~ios_base(local_2d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c8);
  std::ios_base::~ios_base(local_158);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_348);
  pTVar21 = local_478;
  DVar4 = local_478->m_updateMethod;
  dVar19 = 1;
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((DescriptorSetLayoutBuilder *)local_348,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
             (VkSampler *)0x0);
  SVar3 = pTVar21->m_shaderInterface;
  if (SVar3 != SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pTVar21 = local_478;
    if (SVar3 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      dVar19 = 1;
      ::vk::DescriptorSetLayoutBuilder::addBinding
                ((DescriptorSetLayoutBuilder *)local_348,local_478->m_descriptorType,1,0x20,
                 (VkSampler *)0x0);
    }
    else {
      if (SVar3 != SHADER_INPUT_DESCRIPTOR_ARRAY) goto LAB_0052b3ba;
      dVar19 = 2;
    }
  }
  ::vk::DescriptorSetLayoutBuilder::addBinding
            ((DescriptorSetLayoutBuilder *)local_348,pTVar21->m_descriptorType,dVar19,0x20,
             (VkSampler *)0x0);
LAB_0052b3ba:
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_1c8,
             (DescriptorSetLayoutBuilder *)local_348,pTVar21->m_vki,pTVar21->m_device,
             (uint)((DVar4 & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
                   DESCRIPTOR_UPDATE_METHOD_WITH_PUSH));
  if (local_318 != (pointer)0x0) {
    operator_delete(local_318,(long)local_308 - (long)local_318);
  }
  pvVar7 = (void *)CONCAT44(VStack_32c,dStack_330);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,(long)local_320 - (long)pvVar7);
  }
  if (local_348 != (undefined1  [8])0x0) {
    operator_delete((void *)local_348,local_338.m_internal - (long)local_348);
  }
  local_398 = (ImmutableSamplerInfo)local_1c8.m_vki;
  DStack_390.m_deviceIface = (DeviceInterface *)local_1c8.m_device;
  DStack_390.m_device = (VkDevice)local_1c8.m_pipeline.m_internal;
  DStack_390.m_allocator = (VkAllocationCallbacks *)local_1c8.m_pipelineLayout.m_internal;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_1c8);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_1c8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  dVar19 = 0;
  if ((ulong)local_478->m_shaderInterface < 4) {
    dVar19 = *(deUint32 *)(&DAT_00aea800 + (ulong)local_478->m_shaderInterface * 4);
  }
  pDVar12 = ::vk::DescriptorPoolBuilder::addType(pDVar12,local_478->m_descriptorType,dVar19);
  descriptorSetLayouts = (VkDescriptorSetLayout *)&DAT_00000001;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_348,pDVar12,local_478->m_vki,
             local_478->m_device,1,1);
  if ((ImmutableSamplerInfo)local_1c8.m_vki != (ImmutableSamplerInfo)0x0) {
    operator_delete(local_1c8.m_vki,local_1c8.m_pipeline.m_internal - (long)local_1c8.m_vki);
  }
  DStack_360.m_allocator._0_4_ = dStack_330;
  DStack_360.m_deviceIface = (DeviceInterface *)pVStack_340;
  local_368.m_internal = (deUint64)local_348;
  DStack_360.m_device._0_4_ = (deUint32)local_338.m_internal;
  DStack_360.m_device._4_4_ = local_338.m_internal._4_4_;
  DStack_360.m_allocator._4_4_ = VStack_32c;
  local_328 = (pointer)local_3c8;
  local_3c8._0_4_ = local_398.bindingIndex;
  local_3c8._4_4_ = local_398.samplerBaseIndex;
  local_348._0_4_ = 0x22;
  pVStack_340 = (pointer)0x0;
  local_338.m_internal = local_368.m_internal;
  dStack_330 = 1;
  local_458.m_internal = 0;
  pVStack_450 = (pointer)0x0;
  local_448 = (void *)0x0;
  dStack_440 = 0;
  if ((local_478->m_updateMethod & ~DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) ==
      DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    local_1c8.m_pipelineLayout.m_internal = 0;
    local_1c8.m_pipeline.m_internal = 0;
    local_1c8.m_device = (VkDevice)0x0;
    local_1c8.m_vki = (DeviceInterface *)0x0;
    dStack_330 = 1;
    pVStack_340 = (pointer)0x0;
    local_3c8._0_4_ = local_398.bindingIndex;
    local_3c8._4_4_ = local_398.samplerBaseIndex;
    local_448 = (void *)0x0;
    dStack_440 = 0;
    local_458.m_internal = 0;
    pVStack_450 = (pointer)0x0;
  }
  else {
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_418,local_478->m_vki,
               local_478->m_device,(VkDescriptorSetAllocateInfo *)local_348);
    local_1c8.m_pipeline.m_internal =
         (deUint64)
         local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
         m_device;
    local_1c8.m_pipelineLayout.m_internal =
         (deUint64)
         local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
         m_allocator;
    local_1c8.m_vki =
         (DeviceInterface *)
         local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
         m_internal;
    local_1c8.m_device =
         (VkDevice)
         local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
         m_deviceIface;
    local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
    m_internal = 0;
    local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_device = (VkDevice)0x0;
    local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
    if (local_458.m_internal != 0) {
      local_468._0_8_ = local_458.m_internal;
      (**(code **)((long)*pVStack_450 + 0x1e8))(pVStack_450,local_448,dStack_440);
    }
    local_448 = (void *)local_1c8.m_pipeline.m_internal;
    dStack_440 = local_1c8.m_pipelineLayout.m_internal;
    local_458.m_internal = (deUint64)local_1c8.m_vki;
    pVStack_450 = (pointer)local_1c8.m_device;
    if ((DeviceInterface *)
        local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
        m_internal != (DeviceInterface *)0x0) {
      local_1c8.m_vki =
           (DeviceInterface *)
           local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
           m_internal;
      (**(code **)((long)*(VkDescriptorPoolSize *)
                          local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                          m_data.deleter.m_deviceIface + 0x1e8))
                (local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                 deleter.m_deviceIface,
                 local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                 deleter.m_device,
                 local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                 deleter.m_allocator);
    }
  }
  pTVar21 = local_478;
  if (local_478->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    writeDescriptorSet(local_478,local_458);
  }
  else if (local_478->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) {
    writeDescriptorSetWithTemplate
              (local_478,local_458,(VkDescriptorSetLayout)local_3c8._0_8_,false,
               (VkPipelineLayout)0x0);
  }
  local_3c8._16_8_ = local_458.m_internal;
  pVStack_3b0 = pVStack_450;
  local_3a8 = local_448;
  dStack_3a0 = dStack_440;
  ComputePipeline::ComputePipeline
            (&local_418,pTVar21->m_vki,pTVar21->m_device,
             ((pTVar21->super_TestInstance).m_context)->m_progCollection,(deUint32)&local_398,
             descriptorSetLayouts);
  pTVar17 = local_478;
  local_1c8.m_descriptorSets = &local_48;
  local_48.m_internal = local_3c8._16_8_;
  DVar4 = pTVar21->m_updateMethod;
  local_1c8.m_numPreBarriers = (pTVar21->m_texelBuffers).m_numTexelBuffers;
  local_1c8.m_vki = pTVar21->m_vki;
  local_1c8.m_device = pTVar21->m_device;
  local_1c8.m_pipeline.m_internal =
       local_418.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_1c8.m_pipelineLayout.m_internal =
       local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  local_1c8.m_numWorkGroups.m_data[0] = 4;
  local_1c8.m_numWorkGroups.m_data[1] = 1;
  local_1c8.m_numWorkGroups.m_data[2] = 1;
  local_1c8.m_preBarriers = (pTVar21->m_texelBuffers).m_bufferBarriers;
  local_1c8.m_postBarriers = &(pTVar21->m_result).m_bufferBarrier;
  local_1c8.m_numDescriptorSets = (int)(DVar4 - DESCRIPTOR_UPDATE_METHOD_LAST < 0xfffffffe);
  local_1c8.m_numDynamicOffsets = 0;
  local_1c8.m_dynamicOffsets = (deUint32 *)0x0;
  local_1c8.m_numPostBarriers = 1;
  local_428 = 0;
  uStack_420 = 0;
  local_438 = 0;
  uStack_430 = 0;
  local_448 = (void *)0x0;
  dStack_440 = 0;
  local_458.m_internal = 0;
  pVStack_450 = (pointer)0x0;
  if (DVar4 == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) {
    writeDescriptorSet(local_478,(VkDescriptorSet)0x0);
    ComputeCommand::submitAndWait
              (&local_1c8,pTVar17->m_queueFamilyIndex,pTVar17->m_queue,&pTVar17->m_updateBuilder);
  }
  else {
    updateTemplate.m_internal = 0;
    rawUpdateData = (pointer)0x0;
    if (DVar4 == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
      writeDescriptorSetWithTemplate
                (local_478,(VkDescriptorSet)0x0,(VkDescriptorSetLayout)local_398,true,
                 (VkPipelineLayout)
                 local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                 object.m_internal);
      updateTemplate.m_internal =
           (pTVar17->m_updateTemplate).super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.
           m_internal;
      rawUpdateData =
           (pTVar17->m_updateRegistry).m_updateEntries.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    pTVar17 = local_478;
    ComputeCommand::submitAndWait
              (&local_1c8,local_478->m_queueFamilyIndex,local_478->m_queue,updateTemplate,
               rawUpdateData);
  }
  pAVar5 = (pTVar17->m_result).m_bufferMem.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            ((pTVar17->m_result).m_vki,(pTVar17->m_result).m_device,
             (VkDeviceMemory)(pAVar5->m_memory).m_internal,pAVar5->m_offset,0x40);
  puVar6 = (undefined8 *)
           ((pTVar17->m_result).m_bufferMem.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  local_428 = puVar6[6];
  uStack_420 = puVar6[7];
  local_438 = puVar6[4];
  uStack_430 = puVar6[5];
  local_448 = (void *)puVar6[2];
  dStack_440 = puVar6[3];
  local_458.m_internal = *puVar6;
  pVStack_450 = (pointer)puVar6[1];
  bVar18 = true;
  uVar22 = 0;
  bVar8 = false;
  do {
    local_468._0_8_ = (&pVStack_450)[uVar22 * 2 + -1];
    local_468._8_8_ = (&pVStack_450)[uVar22 * 2];
    iVar20 = 0x58;
    if ((pTVar17->m_texelBuffers).m_numTexelBuffers == 1) {
      iVar20 = 0x30;
    }
    if ((uVar22 & 1) == 0) {
      iVar20 = 0x30;
    }
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)local_3c8,iVar20 + (int)&pTVar17->m_texelBuffers,
               (&BindingModel::(anonymous_namespace)::TexelBufferInstanceBuffers::getFetchPos(int)::
                 fetchPositions)[uVar22],0);
    lVar16 = 0;
    do {
      afStack_40[lVar16] = 0.003921569;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    lVar16 = 0;
    do {
      *(undefined4 *)(local_348 + lVar16 * 4) = 0xbf800000;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    bVar10 = true;
    if (((float)local_468._0_4_ == (float)local_348._0_4_) &&
       (!NAN((float)local_468._0_4_) && !NAN((float)local_348._0_4_))) {
      uVar13 = 0xffffffffffffffff;
      while (uVar13 != 2) {
        lVar16 = uVar13 + 2;
        uVar14 = uVar13 + 1;
        pfVar1 = (float *)((long)&pVStack_340 + uVar13 * 4);
        if ((*(float *)(local_468 + lVar16 * 4) != *pfVar1) ||
           (uVar13 = uVar14, NAN(*(float *)(local_468 + lVar16 * 4)) || NAN(*pfVar1)))
        goto LAB_0052b9a8;
      }
      uVar14 = 3;
LAB_0052b9a8:
      bVar10 = bVar8;
      if (uVar14 < 3) {
        bVar10 = true;
      }
    }
    local_378[0] = 0.0;
    local_378[1] = 0.0;
    local_378[2] = 0.0;
    local_378[3] = 0.0;
    lVar16 = 0;
    do {
      local_378[lVar16] = *(float *)(local_468 + lVar16 * 4) - *(float *)(local_3c8 + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    local_348 = (undefined1  [8])0x0;
    pVStack_340 = (pointer)0x0;
    lVar16 = 0;
    do {
      fVar2 = local_378[lVar16];
      fVar24 = -fVar2;
      if (-fVar2 <= fVar2) {
        fVar24 = fVar2;
      }
      *(float *)(local_348 + lVar16 * 4) = fVar24;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    local_46c[0] = '\0';
    local_46c[1] = '\0';
    local_46c[2] = '\0';
    local_46c[3] = '\0';
    lVar16 = 0;
    do {
      local_46c[lVar16] =
           afStack_40[lVar16] <= *(float *)(local_348 + lVar16 * 4) &&
           *(float *)(local_348 + lVar16 * 4) != afStack_40[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 4);
    if (local_46c[0] == '\0') {
      uVar13 = 0xffffffffffffffff;
      do {
        if (uVar13 == 2) {
          uVar14 = 3;
          break;
        }
        uVar14 = uVar13 + 1;
        lVar16 = uVar13 + 2;
        uVar13 = uVar14;
      } while (local_46c[lVar16] != '\x01');
      if (uVar14 < 3) goto LAB_0052ba75;
    }
    else {
LAB_0052ba75:
      local_348 = (undefined1  [8])((local_478->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_340);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_340,"Test sample ",0xc)
      ;
      std::ostream::operator<<((ostringstream *)&pVStack_340,(int)uVar22);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_340,": Expected ",0xb);
      tcu::operator<<((ostream *)&pVStack_340,(Vector<float,_4> *)local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_340,", got ",6);
      tcu::operator<<((ostream *)&pVStack_340,(Vector<float,_4> *)local_468);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_340);
      std::ios_base::~ios_base(local_2d0);
      bVar18 = false;
    }
    pTVar9 = local_3d0;
    uVar22 = uVar22 + 1;
    bVar8 = bVar10;
    if (uVar22 == 4) {
      if (bVar18) {
        local_348 = (undefined1  [8])&local_338;
        pVStack_340 = (pointer)0x4;
        local_338.m_internal._0_5_ = 0x73736150;
        local_3d0->m_code = QP_TEST_RESULT_PASS;
        (local_3d0->m_description)._M_dataplus._M_p = (pointer)&(local_3d0->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_3d0->m_description,local_348);
      }
      else if (bVar10) {
        local_348 = (undefined1  [8])&local_338;
        local_468._0_8_ = (pointer)0x15;
        local_348 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_348,(ulong)local_468);
        local_338.m_internal = local_468._0_8_;
        ((pointer)local_348)->binding = 0x61766e49;
        ((pointer)local_348)->descriptorType = 0x2064696c;
        ((pointer)local_348)->descriptorCount = 0x75736572;
        ((pointer)local_348)->stageFlags = 0x7620746c;
        *(undefined8 *)((long)&((pointer)local_348)->stageFlags + 1) = 0x7365756c61762074;
        pVStack_340 = (pointer)local_468._0_8_;
        *(undefined1 *)((long)&((pointer)local_348)->binding + local_468._0_8_) = 0;
        pTVar9->m_code = QP_TEST_RESULT_FAIL;
        (pTVar9->m_description)._M_dataplus._M_p = (pointer)&(pTVar9->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar9->m_description,local_348,
                   (long)(VkDescriptorType *)local_468._0_8_ + (long)local_348);
      }
      else {
        local_348 = (undefined1  [8])((local_478->super_TestInstance).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pVStack_340,"Result buffer was not written to.",0x21);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_340);
        std::ios_base::~ios_base(local_2d0);
        local_348 = (undefined1  [8])&local_338;
        local_468._0_8_ = (pointer)0x20;
        local_348 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_348,(ulong)local_468);
        local_338.m_internal = local_468._0_8_;
        ((pointer)local_348)->pImmutableSamplers = (VkSampler *)0x727720746f6e2073;
        *(undefined8 *)((long)local_348 + 0x18) = 0x6f74206e65747469;
        ((pointer)local_348)->binding = 0x75736552;
        ((pointer)local_348)->descriptorType = 0x6220746c;
        ((pointer)local_348)->descriptorCount = 0x65666675;
        ((pointer)local_348)->stageFlags = 0x61772072;
        pVStack_340 = (pointer)local_468._0_8_;
        *(undefined1 *)((long)&((pointer)local_348)->binding + local_468._0_8_) = 0;
        pTVar9->m_code = QP_TEST_RESULT_FAIL;
        (pTVar9->m_description)._M_dataplus._M_p = (pointer)&(pTVar9->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar9->m_description,local_348,
                   (long)(VkDescriptorType *)local_468._0_8_ + (long)local_348);
      }
      if (local_348 != (undefined1  [8])&local_338) {
        operator_delete((void *)local_348,(ulong)(local_338.m_internal + 1));
      }
      if (local_418.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
          m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&local_418.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                    deleter,(VkPipeline)
                            local_418.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.
                            m_data.object.m_internal);
      }
      local_418.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_418.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)0x0;
      local_418.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           0;
      local_418.m_pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)0x0;
      if (local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
          m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  (&local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data
                    .deleter,
                   (VkPipelineLayout)
                   local_418.m_pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                   object.m_internal);
      }
      if ((pointer)local_3c8._16_8_ != (pointer)0x0) {
        local_348 = (undefined1  [8])local_3c8._16_8_;
        (**(code **)((long)*pVStack_3b0 + 0x1e8))(pVStack_3b0,local_3a8,dStack_3a0,1);
      }
      if (local_368.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&DStack_360,local_368);
      }
      if (local_398 != (ImmutableSamplerInfo)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&DStack_390,(VkDescriptorSetLayout)local_398);
      }
      return pTVar9;
    }
  } while( true );
}

Assistant:

tcu::TestStatus TexelBufferComputeInstance::iterate (void)
{
	logTestPlan();
	return testResourceAccess();
}